

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O1

int __thiscall OIDType::serialise(OIDType *this,uint8_t *buf,size_t max_len)

{
  pointer __src;
  uint uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  int iVar4;
  uint uVar5;
  
  uVar2 = (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  uVar1 = 0xffffffe1;
  if (1 < max_len) {
    *buf = (char)(this->super_BER_CONTAINER)._type;
    puVar3 = buf + 1;
    iVar4 = 1;
    if (0x7f < uVar2) {
      if (uVar2 < 0x101) {
        *puVar3 = 0x81;
        puVar3 = buf + 2;
        iVar4 = 2;
      }
      else {
        *puVar3 = 0x82;
        buf[2] = (uint8_t)(uVar2 >> 8);
        puVar3 = buf + 3;
        iVar4 = 3;
      }
    }
    *puVar3 = (uint8_t)uVar2;
    uVar1 = 0xffffffe1;
    if ((iVar4 + 1U) + uVar2 <= max_len) {
      uVar1 = iVar4 + 1U;
    }
  }
  uVar5 = uVar1;
  if ((-1 < (int)uVar1) && (uVar5 = 0xffffffdb, this->valid == true)) {
    __src = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    memcpy(buf + uVar1,__src,
           (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)__src);
    uVar5 = ((int)(buf + uVar1) +
            (*(int *)&(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
            *(int *)&(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start)) - (int)buf;
  }
  return uVar5;
}

Assistant:

int OIDType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, this->data.size());
    CHECK_ENCODE_ERR(i);
    if(!this->valid) return SNMP_BUFFER_ENCODE_ERROR_INVALID_OID;

    uint8_t* ptr = buf + i;
    memcpy(ptr, this->data.data(), this->data.size());

    ptr += this->data.size();
    return ptr - buf;
}